

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_back_compat_test_common.c
# Opt level: O1

void device_twin_callback
               (DEVICE_TWIN_UPDATE_STATE update_state,uchar *payload,size_t size,void *user_ctx)

{
  LOGGER_LOG p_Var1;
  char *pcVar2;
  
  p_Var1 = xlogging_get_log_function();
  if (p_Var1 != (LOGGER_LOG)0x0) {
    pcVar2 = DEVICE_TWIN_UPDATE_STATEStrings(update_state);
    (*p_Var1)(AZ_LOG_INFO,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/tests/common_test_files/iothub_back_compat_test_common.c"
              ,"device_twin_callback",0xa2,1,
              "device_twin_callback invoked, status=<%s>, user_ctx=<%p>",pcVar2,user_ctx);
  }
  if (user_ctx != (void *)0x0) {
    *(undefined1 *)((long)user_ctx + 2) = 1;
  }
  return;
}

Assistant:

static void device_twin_callback(DEVICE_TWIN_UPDATE_STATE update_state, const unsigned char* payload, size_t size, void* user_ctx)
{
    (void)payload;
    (void)size;
    LogInfo("device_twin_callback invoked, status=<%s>, user_ctx=<%p>", MU_ENUM_TO_STRING(DEVICE_TWIN_UPDATE_STATE, update_state), user_ctx);

    BACK_COMPAT_MSG_CTX* back_compat_info = (BACK_COMPAT_MSG_CTX*)user_ctx;
    if (back_compat_info)
    {
        back_compat_info->twin_callback_recv = true;
    }
}